

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O3

void __thiscall Pl_Base64::decode(Pl_Base64 *this,uchar *data,size_t len)

{
  byte bVar1;
  size_t sVar2;
  uchar *p;
  size_t sVar3;
  
  if (len != 0) {
    sVar3 = 0;
    do {
      bVar1 = data[sVar3];
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
        sVar2 = this->pos;
        this->pos = sVar2 + 1;
        this->buf[sVar2] = bVar1;
        if (this->pos == 4) {
          flush(this);
        }
      }
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  return;
}

Assistant:

void
Pl_Base64::decode(unsigned char const* data, size_t len)
{
    unsigned char const* p = data;
    while (len > 0) {
        if (!util::is_space(to_c(*p))) {
            this->buf[this->pos++] = *p;
            if (this->pos == 4) {
                flush();
            }
        }
        ++p;
        --len;
    }
}